

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.h
# Opt level: O2

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  cmsys::RegularExpression::RegularExpression(&this->Regex,regex);
  (this->Properties).Exclude = false;
  (this->Properties).Permissions = 0;
  std::__cxx11::string::string((string *)&this->RegexString,(string *)regex);
  return;
}

Assistant:

MatchRule(std::string const& regex)
      : Regex(regex)
      , RegexString(regex)
    {
    }